

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  long lVar1;
  bool bVar2;
  Result *pRVar3;
  ArgMinLayerParams *pAVar4;
  Type *pTVar5;
  long lVar6;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  pRVar3 = Result::operator=(&r,(Result *)&err);
  bVar2 = Result::good(pRVar3);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    pRVar3 = Result::operator=(&r,(Result *)&err);
    bVar2 = Result::good(pRVar3);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    if (bVar2) {
      pAVar4 = Specification::NeuralNetworkLayer::argmin(layer);
      if (pAVar4->removedim_ == false) {
        std::__cxx11::string::string((string *)&local_40,"ArgMin",(allocator *)&local_60);
        validateInputOutputRankEquality((Result *)&err,layer,&local_40,&this->blobNameToRank);
        pRVar3 = Result::operator=(&r,(Result *)&err);
        bVar2 = Result::good(pRVar3);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_40);
        if (!bVar2) goto LAB_005a06f4;
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        pAVar4 = Specification::NeuralNetworkLayer::argmin(layer);
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
        lVar6 = (long)(int)pTVar5->rank_;
        lVar1 = pAVar4->axis_;
        if (SBORROW8(lVar1,-lVar6) != lVar1 + lVar6 < 0 || lVar6 <= lVar1) {
          std::operator+(&local_60,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (layer->name_).ptr_);
          std::operator+(&err,&local_60,"\' layer.");
          std::__cxx11::string::~string((string *)&local_60);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          std::__cxx11::string::~string((string *)&err);
          goto LAB_005a0701;
        }
      }
      Result::Result(__return_storage_ptr__);
      goto LAB_005a0701;
    }
  }
LAB_005a06f4:
  Result::Result(__return_storage_ptr__,&r);
LAB_005a0701:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!layer.argmin().removedim()) {
        if (!(r = validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank)).good()) return r;
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}